

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_dry_clone(llama_sampler *smpl)

{
  llama_sampler *plVar1;
  llama_sampler_dry *result_ctx;
  llama_sampler *result;
  llama_vocab dummy_vocab;
  llama_sampler_dry *ctx;
  size_t in_stack_00000090;
  char **in_stack_00000098;
  int32_t in_stack_000000a4;
  int32_t in_stack_000000a8;
  float in_stack_000000ac;
  float in_stack_000000b0;
  int32_t in_stack_000000b4;
  llama_vocab *in_stack_000000b8;
  ring_buffer<int> *in_stack_ffffffffffffffa8;
  ring_buffer<int> *in_stack_ffffffffffffffb0;
  llama_vocab *in_stack_ffffffffffffffc0;
  
  llama_vocab::llama_vocab(in_stack_ffffffffffffffc0);
  plVar1 = llama_sampler_init_dry
                     (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000ac,
                      in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000090);
  std::
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=((unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)in_stack_ffffffffffffffb0,
              (unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)in_stack_ffffffffffffffa8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)smpl,(vector<int,_std::allocator<int>_> *)ctx);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)in_stack_ffffffffffffffb0,
              (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)in_stack_ffffffffffffffa8);
  ring_buffer<int>::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  llama_vocab::~llama_vocab((llama_vocab *)0x521a8c);
  return plVar1;
}

Assistant:

static struct llama_sampler * llama_sampler_dry_clone(const struct llama_sampler * smpl) {
    const auto * ctx = (llama_sampler_dry *) smpl->ctx;

    llama_vocab dummy_vocab;

    // dummy vocab is passed because it is only needed for raw sequence breaker processing, which we have already done and will simply be copying
    auto * result = llama_sampler_init_dry(&dummy_vocab, ctx->total_context_size, ctx->dry_multiplier, ctx->dry_base, ctx->dry_allowed_length, ctx->dry_penalty_last_n, NULL, 0);

    // Copy the state, including the processed breakers
    {
        auto * result_ctx = (llama_sampler_dry *) result->ctx;
        result_ctx->dry_processed_breakers = ctx->dry_processed_breakers;
        result_ctx->dry_repeat_count = ctx->dry_repeat_count;
        result_ctx->dry_max_token_repeat = ctx->dry_max_token_repeat;
        result_ctx->last_tokens = ctx->last_tokens;
    }

    return result;
}